

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  uint uVar7;
  undefined8 uVar8;
  uint s;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  uint8 uVar15;
  component_t cVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  byte local_a8 [3];
  component_t cStack_a5;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9c;
  byte local_9b;
  byte local_9a;
  color_quad_u8 block_colors [4];
  
  trial_solution->m_valid = false;
  ppVar5 = this->m_pParams;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar9 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar5->m_base_color5).field_0.field_0.r;
    iVar18 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar21 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar26 = iVar18;
    if (iVar9 < iVar18) {
      iVar26 = iVar9;
    }
    if (iVar21 <= iVar26) {
      iVar26 = iVar21;
    }
    if (iVar26 < -4) {
      return false;
    }
    if (iVar18 < iVar9) {
      iVar18 = iVar9;
    }
    if (iVar18 <= iVar21) {
      iVar18 = iVar21;
    }
    if (3 < iVar18) {
      return false;
    }
  }
  bVar1 = (coords->m_unscaled_color).field_0.field_0.r;
  if (coords->m_color4 == true) {
    uVar23 = (uint)bVar1 << 4 | (uint)bVar1;
    uVar22 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
    uVar22 = uVar22 << 4 | uVar22;
    uVar24 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
    uVar24 = uVar24 << 4 | uVar24;
  }
  else {
    uVar23 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.g;
    uVar22 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    bVar1 = (coords->m_unscaled_color).field_0.field_0.b;
    uVar24 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
  }
  if (0xfe < uVar23) {
    uVar23 = 0xff;
  }
  if (0xfe < uVar22) {
    uVar22 = 0xff;
  }
  if (0xfe < uVar24) {
    uVar24 = 0xff;
  }
  trial_solution->m_error = 0xffffffffffffffff;
  puVar13 = &g_etc1_inten_tables;
  lVar12 = 0;
  do {
    lVar11 = 0;
    do {
      iVar26 = puVar13[lVar11];
      uVar19 = iVar26 + uVar23;
      iVar18 = iVar26 + uVar22;
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      if (0xfe < (int)uVar19) {
        uVar19 = 0xff;
      }
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      cVar16 = (component_t)iVar18;
      if (0xfe < iVar18) {
        cVar16 = 0xff;
      }
      block_colors[lVar11 + -0xc].field_0.field_0.r = (component_t)uVar19;
      iVar18 = iVar26 + uVar24;
      if ((int)(iVar26 + uVar24) < 1) {
        iVar18 = 0;
      }
      block_colors[lVar11 + -0xc].field_0.field_0.g = cVar16;
      cVar16 = (component_t)iVar18;
      if (0xfe < iVar18) {
        cVar16 = 0xff;
      }
      block_colors[lVar11 + -0xc].field_0.field_0.b = cVar16;
      block_colors[lVar11 + -0xc].field_0.field_0.a = '\0';
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    pcVar6 = this->m_pParams->m_pSrc_pixels;
    uVar25 = 0;
    uVar14 = 0;
    do {
      bVar1 = pcVar6[uVar14].field_0.field_0.r;
      uVar17 = (uint)bVar1;
      bVar2 = pcVar6[uVar14].field_0.field_0.g;
      uVar20 = (uint)bVar2;
      bVar3 = pcVar6[uVar14].field_0.field_0.b;
      iVar26 = (uint)bVar3 - (uint)local_a8[2];
      uVar27 = iVar26 * iVar26 +
               (uVar20 - local_a8[1]) * (uVar20 - local_a8[1]) +
               (uVar17 - local_a8[0]) * (uVar17 - local_a8[0]);
      iVar26 = (uint)bVar1 - (uint)local_a4;
      iVar9 = (uint)bVar2 - (uint)local_a3;
      iVar18 = (uint)bVar3 - (uint)local_a2;
      uVar10 = iVar18 * iVar18 + iVar9 * iVar9 + iVar26 * iVar26;
      uVar19 = uVar10;
      if (uVar10 >= uVar27) {
        uVar19 = uVar27;
      }
      iVar26 = (uint)bVar3 - (uint)local_9e;
      uVar28 = iVar26 * iVar26 +
               (uVar20 - local_9f) * (uVar20 - local_9f) + (uVar17 - local_a0) * (uVar17 - local_a0)
      ;
      uVar7 = uVar28;
      if (uVar19 <= uVar28) {
        uVar7 = uVar19;
      }
      uVar15 = uVar10 < uVar27;
      if (uVar19 > uVar28) {
        uVar15 = '\x02';
      }
      iVar26 = (uint)bVar3 - (uint)local_9a;
      uVar10 = iVar26 * iVar26 +
               (uVar20 - local_9b) * (uVar20 - local_9b) + (uVar17 - local_9c) * (uVar17 - local_9c)
      ;
      uVar19 = uVar10;
      if (uVar7 <= uVar10) {
        uVar19 = uVar7;
      }
      if (uVar7 > uVar10) {
        uVar15 = '\x03';
      }
      this->m_temp_selectors[uVar14] = uVar15;
      uVar25 = uVar19 + uVar25;
    } while ((uVar25 < trial_solution->m_error) &&
            (bVar29 = uVar14 < 7, uVar14 = uVar14 + 1, bVar29));
    if (uVar25 < trial_solution->m_error) {
      trial_solution->m_error = uVar25;
      (trial_solution->m_coords).m_inten_table = (uint)lVar12;
      *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
      trial_solution->m_valid = true;
    }
    lVar12 = lVar12 + 1;
    puVar13 = puVar13 + 4;
  } while (lVar12 != 8);
  aVar4 = (coords->m_unscaled_color).field_0;
  (trial_solution->m_coords).m_unscaled_color.field_0 = aVar4;
  (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
  if ((pBest_solution != (potential_solution *)0x0) &&
     (trial_solution->m_error < pBest_solution->m_error)) {
    (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar4;
    (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
    (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
    uVar8 = *(undefined8 *)&trial_solution->field_0x14;
    *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
    *(undefined8 *)&pBest_solution->field_0x14 = uVar8;
    *(undefined8 *)((long)&pBest_solution->m_error + 1) =
         *(undefined8 *)((long)&trial_solution->m_error + 1);
    return true;
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = rg_etc1::square(src_pixel.r - block_colors[0].r) + rg_etc1::square(src_pixel.g - block_colors[0].g) + rg_etc1::square(src_pixel.b - block_colors[0].b);

      uint trial_error = rg_etc1::square(src_pixel.r - block_colors[1].r) + rg_etc1::square(src_pixel.g - block_colors[1].g) + rg_etc1::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[2].r) + rg_etc1::square(src_pixel.g - block_colors[2].g) + rg_etc1::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[3].r) + rg_etc1::square(src_pixel.g - block_colors[3].g) + rg_etc1::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, 8);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}